

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_copy.cpp
# Opt level: O1

ON_SubD * __thiscall ON_SubD::operator=(ON_SubD *this,ON_SubD *src)

{
  if (this != src) {
    Destroy(this);
    CopyHelper(this,src);
    ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
  }
  return this;
}

Assistant:

ON_SubD& ON_SubD::operator=(const ON_SubD& src)
{
  if ( this != &src )
  {
    this->Destroy();
    this->CopyHelper(src);
    // The next line copies user data
    ON_Geometry::operator=(src);
  }
  return *this;
}